

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O0

optional<fs::path> * node::FindSnapshotChainstateDir(path *data_dir)

{
  long lVar1;
  bool bVar2;
  string *in_RSI;
  optional<fs::path> *in_RDI;
  long in_FS_OFFSET;
  path possible_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  optional<fs::path> *p1;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  fs::path::path((path *)in_stack_ffffffffffffff18,(path *)0x953895);
  tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_ffffffffffffff48,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  fs::u8path(in_RSI);
  fs::operator/((path *)p1,(path *)in_RDI);
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  bVar2 = fs::exists((path *)in_stack_ffffffffffffff18);
  if (bVar2) {
    std::optional<fs::path>::optional<fs::path,_true>
              (in_RDI,(path *)CONCAT17(bVar2,in_stack_ffffffffffffff20));
  }
  else {
    std::optional<fs::path>::optional(in_RDI);
  }
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return p1;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<fs::path> FindSnapshotChainstateDir(const fs::path& data_dir)
{
    fs::path possible_dir =
        data_dir / fs::u8path(strprintf("chainstate%s", SNAPSHOT_CHAINSTATE_SUFFIX));

    if (fs::exists(possible_dir)) {
        return possible_dir;
    }
    return std::nullopt;
}